

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_manager.cpp
# Opt level: O0

void __thiscall CfdCoreManager_Initialize_Test::TestBody(CfdCoreManager_Initialize_Test *this)

{
  bool bVar1;
  AssertHelper local_a0;
  Message local_98 [2];
  CfdException *anon_var_0;
  byte local_7d;
  bool gtest_caught_expected;
  ConstCharPtr local_70;
  ConstCharPtr gtest_msg;
  CfdCoreHandle handle;
  CfdCoreManagerFinalizedTest finalize_test;
  CfdCoreManager_Initialize_Test *this_local;
  
  finalize_test._72_8_ = this;
  CfdCoreManagerFinalizedTest::CfdCoreManagerFinalizedTest((CfdCoreManagerFinalizedTest *)&handle);
  gtest_msg.value = (char *)0x0;
  testing::internal::ConstCharPtr::ConstCharPtr(&local_70,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_70);
  if (bVar1) {
    local_7d = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::CfdCoreManager::Initialize(&handle);
    }
    if ((local_7d & 1) != 0) goto LAB_004b0dfd;
    local_70.value =
         "Expected: (finalize_test.Initialize(&handle)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_98);
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_manager.cpp"
             ,0x3b,local_70.value);
  testing::internal::AssertHelper::operator=(&local_a0,local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  testing::Message::~Message(local_98);
LAB_004b0dfd:
  CfdCoreManagerFinalizedTest::~CfdCoreManagerFinalizedTest((CfdCoreManagerFinalizedTest *)&handle);
  return;
}

Assistant:

TEST(CfdCoreManager, Initialize) {
  CfdCoreManagerFinalizedTest finalize_test;
  CfdCoreHandle handle = nullptr;
  EXPECT_THROW((finalize_test.Initialize(&handle)), CfdException);
}